

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * exprINAffinity(Parse *pParse,Expr *pExpr)

{
  Expr *pVector;
  int iVar1;
  u8 uVar2;
  char aff2;
  Select *pSVar3;
  char *pcVar4;
  Expr *pExpr_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  pVector = pExpr->pLeft;
  uVar2 = pVector->op;
  if (uVar2 == 0xa8) {
    uVar2 = pVector->op2;
  }
  if (uVar2 == 0x83) {
    pSVar3 = (pVector->x).pSelect;
  }
  else {
    uVar6 = 1;
    if (uVar2 != 0xa9) goto LAB_00197ee3;
    pSVar3 = (Select *)&pVector->x;
  }
  uVar6 = (ulong)(uint)((anon_union_8_2_a01b6dbf_for_x *)&pSVar3->pEList)->pList->nExpr;
LAB_00197ee3:
  if ((pExpr->flags & 0x800) == 0) {
    pSVar3 = (Select *)0x0;
  }
  else {
    pSVar3 = (pExpr->x).pSelect;
  }
  iVar1 = (int)uVar6;
  if (pParse->db == (sqlite3 *)0x0) {
    pcVar4 = (char *)sqlite3Malloc((long)(iVar1 + 1));
  }
  else {
    pcVar4 = (char *)sqlite3DbMallocRawNN(pParse->db,(long)(iVar1 + 1));
  }
  if (pcVar4 != (char *)0x0) {
    if (0 < iVar1) {
      lVar5 = 8;
      uVar7 = 0;
      do {
        pExpr_00 = sqlite3VectorFieldSubexpr(pVector,(int)uVar7);
        aff2 = sqlite3ExprAffinity(pExpr_00);
        if (pSVar3 != (Select *)0x0) {
          aff2 = sqlite3CompareAffinity(*(Expr **)((long)pSVar3->pEList->a + lVar5 + -8),aff2);
        }
        pcVar4[uVar7] = aff2;
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x20;
      } while (uVar6 != uVar7);
    }
    pcVar4[iVar1] = '\0';
  }
  return pcVar4;
}

Assistant:

static char *exprINAffinity(Parse *pParse, Expr *pExpr){
  Expr *pLeft = pExpr->pLeft;
  int nVal = sqlite3ExprVectorSize(pLeft);
  Select *pSelect = (pExpr->flags & EP_xIsSelect) ? pExpr->x.pSelect : 0;
  char *zRet;

  assert( pExpr->op==TK_IN );
  zRet = sqlite3DbMallocRaw(pParse->db, nVal+1);
  if( zRet ){
    int i;
    for(i=0; i<nVal; i++){
      Expr *pA = sqlite3VectorFieldSubexpr(pLeft, i);
      char a = sqlite3ExprAffinity(pA);
      if( pSelect ){
        zRet[i] = sqlite3CompareAffinity(pSelect->pEList->a[i].pExpr, a);
      }else{
        zRet[i] = a;
      }
    }
    zRet[nVal] = '\0';
  }
  return zRet;
}